

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O3

void __thiscall
Assimp::MDLImporter::SortByMaterials_3DGS_MDL7
          (MDLImporter *this,IntGroupInfo_MDL7 *groupInfo,IntGroupData_MDL7 *groupData,
          IntSplitGroupData_MDL7 *splitGroupData)

{
  pointer ppaVar1;
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar2;
  iterator iVar3;
  pointer paVar4;
  uint uVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  Logger *pLVar7;
  MDLImporter *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **ppvVar8;
  pointer pIVar9;
  pointer pIVar10;
  uint uVar11;
  MDLImporter *this_01;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *this_02;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  pointer ppvVar17;
  vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_> avMats;
  IntMaterial_MDL7 sHelper;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  aiTempSplit;
  uint local_8c;
  vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_> local_88;
  IntGroupInfo_MDL7 *local_70;
  IntMaterial_MDL7 local_68;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  local_50;
  IntGroupData_MDL7 *local_38;
  
  uVar13 = (long)(splitGroupData->shared->pcMats).
                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(splitGroupData->shared->pcMats).
                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
  uVar16 = (long)uVar13 >> 3;
  uVar15 = (uint)uVar16;
  local_70 = groupInfo;
  if (groupData->bNeed2UV == false) {
    paVar4 = (groupData->vTextureCoords2).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((groupData->vTextureCoords2).
        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish != paVar4) {
      (groupData->vTextureCoords2).
      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = paVar4;
    }
    ppvVar8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)
              operator_new__(uVar13 & 0x7fffffff8);
    splitGroupData->aiSplit = ppvVar8;
    if (uVar15 != 0) {
      uVar13 = 0;
      do {
        pvVar6 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
        (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        splitGroupData->aiSplit[uVar13] = pvVar6;
        uVar13 = uVar13 + 1;
      } while ((uVar16 & 0xffffffff) != uVar13);
    }
    local_88.
    super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)local_88.
                          super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                          ._M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
    if (local_70->pcGroup->numtris != 0) {
      uVar14 = 0;
      do {
        uVar11 = (groupData->pcFaces).
                 super__Vector_base<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar14].iMatIndex[0];
        if (uVar11 < uVar15) {
          pvVar2 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                   splitGroupData->aiSplit[uVar11];
          iVar3._M_current = *(uint **)(pvVar2 + 8);
          if (iVar3._M_current == *(uint **)(pvVar2 + 0x10)) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>(pvVar2,iVar3,(uint *)&local_88);
          }
          else {
            *iVar3._M_current = uVar14;
            *(long *)(pvVar2 + 8) = *(long *)(pvVar2 + 8) + 4;
          }
        }
        else {
          pvVar2 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                   splitGroupData->aiSplit[uVar15 - 1];
          iVar3._M_current = *(uint **)(pvVar2 + 8);
          if (iVar3._M_current == *(uint **)(pvVar2 + 0x10)) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>(pvVar2,iVar3,(uint *)&local_88);
          }
          else {
            *iVar3._M_current = uVar14;
            *(long *)(pvVar2 + 8) = *(long *)(pvVar2 + 8) + 4;
          }
          if ((groupData->pcFaces).
              super__Vector_base<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
              ._M_impl.super__Vector_impl_data._M_start
              [(ulong)local_88.
                      super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                      ._M_impl.super__Vector_impl_data._M_start & 0xffffffff].iMatIndex[0] !=
              0xffffffff) {
            pLVar7 = DefaultLogger::get();
            Logger::warn(pLVar7,"Index overflow in MDL7 material list [#0]");
          }
        }
        uVar14 = (int)local_88.
                      super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1;
        local_88.
        super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_88.
                               super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar14);
      } while (uVar14 < (uint)local_70->pcGroup->numtris);
    }
  }
  else {
    local_88.
    super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
    ._M_impl.super__Vector_impl_data._M_start = (IntMaterial_MDL7 *)0x0;
    local_88.
    super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
    ._M_impl.super__Vector_impl_data._M_finish = (IntMaterial_MDL7 *)0x0;
    local_88.
    super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (IntMaterial_MDL7 *)0x0;
    uVar13 = (ulong)((uint)(uVar13 >> 2) & 0xfffffffe);
    std::vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>::
    reserve(&local_88,uVar13);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
    ::vector(&local_50,uVar13,(allocator_type *)&local_68);
    if (uVar15 != 0) {
      uVar13 = 0;
      do {
        pvVar6 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
        (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_50.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar13] = pvVar6;
        uVar13 = uVar13 + 1;
      } while ((uVar16 & 0xffffffff) != uVar13);
    }
    local_8c = 0;
    if (local_70->pcGroup->numtris != 0) {
      uVar14 = uVar15 - 1;
      local_38 = groupData;
      do {
        uVar13 = (ulong)local_8c;
        pIVar9 = (groupData->pcFaces).
                 super__Vector_base<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar11 = pIVar9[uVar13].iMatIndex[0];
        uVar12 = uVar11;
        if ((uVar15 <= uVar11) && (uVar12 = uVar14, uVar11 != 0xffffffff)) {
          pLVar7 = DefaultLogger::get();
          Logger::warn(pLVar7,"Index overflow in MDL7 material list [#1]");
          uVar13 = (ulong)local_8c;
          pIVar9 = (groupData->pcFaces).
                   super__Vector_base<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
        uVar11 = pIVar9[uVar13].iMatIndex[1];
        if ((uVar11 == 0xffffffff) || (uVar12 == uVar11)) {
          uVar13 = (ulong)uVar12;
        }
        else {
          if (uVar15 <= uVar11) {
            pLVar7 = DefaultLogger::get();
            Logger::warn(pLVar7,"Index overflow in MDL7 material list [#2]");
            uVar11 = uVar14;
          }
          if (local_88.
              super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_88.
              super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            uVar5 = 0;
            pIVar10 = local_88.
                      super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              if ((pIVar10->iOldMatIndices[0] == uVar12) && (pIVar10->iOldMatIndices[1] == uVar11))
              goto LAB_00474e28;
              pIVar10 = pIVar10 + 1;
              uVar5 = uVar5 + 1;
            } while (pIVar10 !=
                     local_88.
                     super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
          local_68.pcMat = (aiMaterial *)0x0;
          local_68.iOldMatIndices[0] = 0;
          local_68.iOldMatIndices[1] = 0;
          this_00 = (MDLImporter *)operator_new(0x10);
          this_01 = this_00;
          aiMaterial::aiMaterial((aiMaterial *)this_00);
          local_68.iOldMatIndices[1] = uVar11;
          local_68.iOldMatIndices[0] = uVar12;
          ppaVar1 = (splitGroupData->shared->pcMats).
                    super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_68.pcMat = (aiMaterial *)this_00;
          JoinSkins_3DGS_MDL7(this_01,ppaVar1[uVar12],ppaVar1[uVar11],(aiMaterial *)this_00);
          if (local_88.
              super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_88.
              super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<Assimp::MDL::IntMaterial_MDL7,std::allocator<Assimp::MDL::IntMaterial_MDL7>>
            ::_M_realloc_insert<Assimp::MDL::IntMaterial_MDL7_const&>
                      ((vector<Assimp::MDL::IntMaterial_MDL7,std::allocator<Assimp::MDL::IntMaterial_MDL7>>
                        *)&local_88,
                       (iterator)
                       local_88.
                       super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_68);
          }
          else {
            *(undefined4 *)
             &(local_88.
               super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
               ._M_impl.super__Vector_impl_data._M_finish)->pcMat = local_68.pcMat._0_4_;
            *(undefined4 *)
             ((long)&(local_88.
                      super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->pcMat + 4) = local_68.pcMat._4_4_
            ;
            (local_88.
             super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
             ._M_impl.super__Vector_impl_data._M_finish)->iOldMatIndices[0] =
                 local_68.iOldMatIndices[0];
            (local_88.
             super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
             ._M_impl.super__Vector_impl_data._M_finish)->iOldMatIndices[1] =
                 local_68.iOldMatIndices[1];
            local_88.
            super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_88.
                 super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          uVar5 = (int)((ulong)((long)local_88.
                                      super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_88.
                                     super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4) - 1;
          groupData = local_38;
LAB_00474e28:
          uVar13 = (ulong)uVar5;
          if ((long)local_50.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_50.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3 == uVar13) {
            local_68.pcMat = (aiMaterial *)operator_new(0x18);
            (((MDLImporter *)local_68.pcMat)->super_BaseImporter)._vptr_BaseImporter =
                 (_func_int **)0x0;
            *(undefined8 *)
             &(((MDLImporter *)local_68.pcMat)->super_BaseImporter).importerUnits._M_t._M_impl = 0;
            *(undefined8 *)
             &(((MDLImporter *)local_68.pcMat)->super_BaseImporter).importerUnits._M_t._M_impl.
              super__Rb_tree_header._M_header = 0;
            std::
            vector<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>*>>
            ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>*>
                      ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>*>>
                        *)&local_50,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> **)&local_68);
          }
        }
        pvVar2 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                 local_50.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar13];
        iVar3._M_current = *(uint **)(pvVar2 + 8);
        if (iVar3._M_current == *(uint **)(pvVar2 + 0x10)) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(pvVar2,iVar3,&local_8c);
        }
        else {
          *iVar3._M_current = local_8c;
          *(long *)(pvVar2 + 8) = *(long *)(pvVar2 + 8) + 4;
        }
        local_8c = local_8c + 1;
      } while (local_8c < (uint)local_70->pcGroup->numtris);
    }
    this_02 = &splitGroupData->shared->pcMats;
    if (local_70->iIndex == 0) {
      std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::resize
                (this_02,(long)local_88.
                               super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_88.
                               super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4);
      if (local_88.
          super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_88.
          super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar14 = 1;
        uVar13 = 0;
        do {
          (splitGroupData->shared->pcMats).
          super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar13] =
               local_88.
               super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar13].pcMat;
          uVar13 = (ulong)uVar14;
          uVar14 = uVar14 + 1;
        } while (uVar13 < (ulong)((long)local_88.
                                        super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_88.
                                        super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
    }
    else {
      uVar13 = uVar16 & 0xffffffff;
      std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::resize
                (this_02,((long)local_88.
                                super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_88.
                                super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4) + uVar13);
      uVar14 = uVar15;
      if (uVar13 < (ulong)((long)local_88.
                                 super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_88.
                                 super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4)) {
        do {
          uVar14 = uVar14 + 1;
          (splitGroupData->shared->pcMats).
          super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar13] =
               local_88.
               super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar13].pcMat;
          uVar13 = (ulong)uVar14;
        } while ((ulong)uVar14 <
                 (ulong)((long)local_88.
                               super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_88.
                               super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
    }
    ppvVar17 = local_50.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    uVar13 = 0xffffffffffffffff;
    if (-1 < (long)local_50.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_50.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start) {
      uVar13 = (long)local_50.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_50.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
    }
    ppvVar8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)operator_new__(uVar13);
    splitGroupData->aiSplit = ppvVar8;
    if (uVar15 != 0) {
      uVar13 = 0;
      do {
        splitGroupData->aiSplit[uVar13] =
             local_50.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar13];
        uVar13 = uVar13 + 1;
        ppvVar17 = local_50.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      } while ((uVar16 & 0xffffffff) != uVar13);
    }
    if (ppvVar17 != (pointer)0x0) {
      operator_delete(ppvVar17,(long)local_50.
                                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)ppvVar17);
    }
    if (local_88.
        super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
        ._M_impl.super__Vector_impl_data._M_start != (IntMaterial_MDL7 *)0x0) {
      operator_delete(local_88.
                      super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.
                            super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.
                            super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void MDLImporter::SortByMaterials_3DGS_MDL7(
    const MDL::IntGroupInfo_MDL7&   groupInfo,
    MDL::IntGroupData_MDL7&         groupData,
    MDL::IntSplitGroupData_MDL7& splitGroupData)
{
    const unsigned int iNumMaterials = (unsigned int)splitGroupData.shared.pcMats.size();
    if (!groupData.bNeed2UV)    {
        // if we don't need a second set of texture coordinates there is no reason to keep it in memory ...
        groupData.vTextureCoords2.clear();

        // allocate the array
        splitGroupData.aiSplit = new std::vector<unsigned int>*[iNumMaterials];

        for (unsigned int m = 0; m < iNumMaterials;++m)
            splitGroupData.aiSplit[m] = new std::vector<unsigned int>();

        // iterate through all faces and sort by material
        for (unsigned int iFace = 0; iFace < (unsigned int)groupInfo.pcGroup->numtris;++iFace)  {
            // check range
            if (groupData.pcFaces[iFace].iMatIndex[0] >= iNumMaterials) {
                // use the last material instead
                splitGroupData.aiSplit[iNumMaterials-1]->push_back(iFace);

                // sometimes MED writes -1, but normally only if there is only
                // one skin assigned. No warning in this case
                if(0xFFFFFFFF != groupData.pcFaces[iFace].iMatIndex[0])
                    ASSIMP_LOG_WARN("Index overflow in MDL7 material list [#0]");
            }
            else splitGroupData.aiSplit[groupData.pcFaces[iFace].
                iMatIndex[0]]->push_back(iFace);
        }
    }
    else
    {
        // we need to build combined materials for each combination of
        std::vector<MDL::IntMaterial_MDL7> avMats;
        avMats.reserve(iNumMaterials*2);

        // fixme: why on the heap?
        std::vector<std::vector<unsigned int>* > aiTempSplit(iNumMaterials*2);
        for (unsigned int m = 0; m < iNumMaterials;++m)
            aiTempSplit[m] = new std::vector<unsigned int>();

        // iterate through all faces and sort by material
        for (unsigned int iFace = 0; iFace < (unsigned int)groupInfo.pcGroup->numtris;++iFace)  {
            // check range
            unsigned int iMatIndex = groupData.pcFaces[iFace].iMatIndex[0];
            if (iMatIndex >= iNumMaterials) {
                // sometimes MED writes -1, but normally only if there is only
                // one skin assigned. No warning in this case
                if(UINT_MAX != iMatIndex)
                    ASSIMP_LOG_WARN("Index overflow in MDL7 material list [#1]");
                iMatIndex = iNumMaterials-1;
            }
            unsigned int iMatIndex2 = groupData.pcFaces[iFace].iMatIndex[1];

            unsigned int iNum = iMatIndex;
            if (UINT_MAX != iMatIndex2 && iMatIndex != iMatIndex2)  {
                if (iMatIndex2 >= iNumMaterials)    {
                    // sometimes MED writes -1, but normally only if there is only
                    // one skin assigned. No warning in this case
                    ASSIMP_LOG_WARN("Index overflow in MDL7 material list [#2]");
                    iMatIndex2 = iNumMaterials-1;
                }

                // do a slow search in the list ...
                iNum = 0;
                bool bFound = false;
                for (std::vector<MDL::IntMaterial_MDL7>::iterator i =  avMats.begin();i != avMats.end();++i,++iNum){
                    if ((*i).iOldMatIndices[0] == iMatIndex && (*i).iOldMatIndices[1] == iMatIndex2)    {
                        // reuse this material
                        bFound = true;
                        break;
                    }
                }
                if (!bFound)    {
                    //  build a new material ...
                    MDL::IntMaterial_MDL7 sHelper;
                    sHelper.pcMat = new aiMaterial();
                    sHelper.iOldMatIndices[0] = iMatIndex;
                    sHelper.iOldMatIndices[1] = iMatIndex2;
                    JoinSkins_3DGS_MDL7(splitGroupData.shared.pcMats[iMatIndex],
                        splitGroupData.shared.pcMats[iMatIndex2],sHelper.pcMat);

                    // and add it to the list
                    avMats.push_back(sHelper);
                    iNum = (unsigned int)avMats.size()-1;
                }
                // adjust the size of the file array
                if (iNum == aiTempSplit.size()) {
                    aiTempSplit.push_back(new std::vector<unsigned int>());
                }
            }
            aiTempSplit[iNum]->push_back(iFace);
        }

        // now add the newly created materials to the old list
        if (0 == groupInfo.iIndex)  {
            splitGroupData.shared.pcMats.resize(avMats.size());
            for (unsigned int o = 0; o < avMats.size();++o)
                splitGroupData.shared.pcMats[o] = avMats[o].pcMat;
        }
        else    {
            // This might result in redundant materials ...
            splitGroupData.shared.pcMats.resize(iNumMaterials + avMats.size());
            for (unsigned int o = iNumMaterials; o < avMats.size();++o)
                splitGroupData.shared.pcMats[o] = avMats[o].pcMat;
        }

        // and build the final face-to-material array
        splitGroupData.aiSplit = new std::vector<unsigned int>*[aiTempSplit.size()];
        for (unsigned int m = 0; m < iNumMaterials;++m)
            splitGroupData.aiSplit[m] = aiTempSplit[m];
    }
}